

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_rsa.cc
# Opt level: O2

int pkey_rsa_keygen(EVP_PKEY_CTX *ctx,EVP_PKEY *pkey)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  RSA *key;
  BIGNUM *a;
  
  piVar1 = (int *)ctx->data;
  if (*(long *)(piVar1 + 2) == 0) {
    a = BN_new();
    *(BIGNUM **)(piVar1 + 2) = a;
    if (a == (BIGNUM *)0x0) {
      return 0;
    }
    iVar3 = BN_set_word(a,0x10001);
    if (iVar3 == 0) {
      return 0;
    }
  }
  key = (RSA *)RSA_new();
  if (key == (RSA *)0x0) {
    iVar3 = 0;
  }
  else {
    iVar3 = 0;
    iVar2 = RSA_generate_key_ex((RSA *)key,*piVar1,*(BIGNUM **)(piVar1 + 2),(BN_GENCB *)0x0);
    if (iVar2 == 0) {
      RSA_free((RSA *)key);
    }
    else {
      EVP_PKEY_assign_RSA(pkey,key);
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

static int pkey_rsa_keygen(EVP_PKEY_CTX *ctx, EVP_PKEY *pkey) {
  RSA *rsa = NULL;
  RSA_PKEY_CTX *rctx = reinterpret_cast<RSA_PKEY_CTX *>(ctx->data);

  if (!rctx->pub_exp) {
    rctx->pub_exp = BN_new();
    if (!rctx->pub_exp || !BN_set_word(rctx->pub_exp, RSA_F4)) {
      return 0;
    }
  }
  rsa = RSA_new();
  if (!rsa) {
    return 0;
  }

  if (!RSA_generate_key_ex(rsa, rctx->nbits, rctx->pub_exp, NULL)) {
    RSA_free(rsa);
    return 0;
  }

  EVP_PKEY_assign_RSA(pkey, rsa);
  return 1;
}